

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
llvm::
DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
::grow(DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
       *this,uint AtLeast)

{
  uint uVar1;
  DenseMapPair<unsigned_long,_unsigned_long> *OldBucketsBegin;
  DenseMapPair<unsigned_long,_unsigned_long> *pDVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = this->NumBuckets;
  OldBucketsBegin = this->Buckets;
  uVar3 = AtLeast - 1 >> 1 | AtLeast - 1;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar3 = (uVar3 >> 0x10 | uVar3) + 1;
  uVar4 = 0x40;
  if (0x40 < uVar3) {
    uVar4 = (ulong)uVar3;
  }
  this->NumBuckets = (uint)uVar4;
  pDVar2 = (DenseMapPair<unsigned_long,_unsigned_long> *)operator_new(uVar4 << 4,8);
  this->Buckets = pDVar2;
  if (OldBucketsBegin != (DenseMapPair<unsigned_long,_unsigned_long> *)0x0) {
    DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
    ::moveFromOldBuckets
              ((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                *)this,OldBucketsBegin,OldBucketsBegin + uVar1);
    operator_delete(OldBucketsBegin,(ulong)uVar1 * 0x10,8);
    return;
  }
  DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  ::initEmpty((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
               *)this);
  return;
}

Assistant:

void grow(unsigned AtLeast) {
    unsigned OldNumBuckets = NumBuckets;
    BucketT *OldBuckets = Buckets;

    allocateBuckets(std::max<unsigned>(64, static_cast<unsigned>(NextPowerOf2(AtLeast-1))));
    assert(Buckets);
    if (!OldBuckets) {
      this->BaseT::initEmpty();
      return;
    }

    this->moveFromOldBuckets(OldBuckets, OldBuckets+OldNumBuckets);

    // Free the old table.
    deallocate_buffer(OldBuckets, sizeof(BucketT) * OldNumBuckets,
                      alignof(BucketT));
  }